

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mish_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Mish_x86_avx512::forward_inplace(Mish_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float __x;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int *piVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  undefined1 (*pauVar17) [16];
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 (*pauVar21) [32];
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar44 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  v4sf one;
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar151 [64];
  Mat local_78;
  undefined1 auVar78 [32];
  
  iVar14 = bottom_top_blob->elempack;
  if (iVar14 == 0x10) {
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78._20_8_ = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    convert_packing(bottom_top_blob,&local_78,8,opt);
    (**this->_vptr_Mish_x86_avx512)(this,&local_78,opt);
    convert_packing(&local_78,bottom_top_blob,0x10,opt);
    piVar13 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar13 != (int *)0x0) {
      LOCK();
      *piVar13 = *piVar13 + -1;
      UNLOCK();
      if (*piVar13 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    uVar18 = bottom_top_blob->c;
    uVar20 = (ulong)uVar18;
    uVar19 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
    auVar23 = in_ZMM16._0_16_;
    if (iVar14 == 8) {
      if (0 < (int)uVar18) {
        auVar68._8_4_ = 0x42b0c0a5;
        auVar68._0_8_ = 0x42b0c0a542b0c0a5;
        auVar68._12_4_ = 0x42b0c0a5;
        auVar68._16_4_ = 0x42b0c0a5;
        auVar68._20_4_ = 0x42b0c0a5;
        auVar68._24_4_ = 0x42b0c0a5;
        auVar68._28_4_ = 0x42b0c0a5;
        auVar69._8_4_ = 0xc2b0c0a5;
        auVar69._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar69._12_4_ = 0xc2b0c0a5;
        auVar69._16_4_ = 0xc2b0c0a5;
        auVar69._20_4_ = 0xc2b0c0a5;
        auVar69._24_4_ = 0xc2b0c0a5;
        auVar69._28_4_ = 0xc2b0c0a5;
        auVar70._8_4_ = 0x3f000000;
        auVar70._0_8_ = 0x3f0000003f000000;
        auVar70._12_4_ = 0x3f000000;
        auVar70._16_4_ = 0x3f000000;
        auVar70._20_4_ = 0x3f000000;
        auVar70._24_4_ = 0x3f000000;
        auVar70._28_4_ = 0x3f000000;
        auVar109._8_4_ = 0x3fb8aa3b;
        auVar109._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar109._12_4_ = 0x3fb8aa3b;
        auVar109._16_4_ = 0x3fb8aa3b;
        auVar109._20_4_ = 0x3fb8aa3b;
        auVar109._24_4_ = 0x3fb8aa3b;
        auVar109._28_4_ = 0x3fb8aa3b;
        uVar15 = 0;
        auVar23 = vxorps_avx512vl(auVar23,auVar23);
        auVar151 = ZEXT1664(auVar23);
        auVar80._8_4_ = 0x3f800000;
        auVar80._0_8_ = 0x3f8000003f800000;
        auVar80._12_4_ = 0x3f800000;
        auVar80._16_4_ = 0x3f800000;
        auVar80._20_4_ = 0x3f800000;
        auVar80._24_4_ = 0x3f800000;
        auVar80._28_4_ = 0x3f800000;
        auVar81._8_4_ = 0x3f318000;
        auVar81._0_8_ = 0x3f3180003f318000;
        auVar81._12_4_ = 0x3f318000;
        auVar81._16_4_ = 0x3f318000;
        auVar81._20_4_ = 0x3f318000;
        auVar81._24_4_ = 0x3f318000;
        auVar81._28_4_ = 0x3f318000;
        auVar78._8_4_ = 0xb95e8083;
        auVar78._0_8_ = 0xb95e8083b95e8083;
        auVar78._12_4_ = 0xb95e8083;
        auVar78._16_4_ = 0xb95e8083;
        auVar78._20_4_ = 0xb95e8083;
        auVar78._24_4_ = 0xb95e8083;
        auVar78._28_4_ = 0xb95e8083;
        auVar100._8_4_ = 0x3ab743ce;
        auVar100._0_8_ = 0x3ab743ce3ab743ce;
        auVar100._12_4_ = 0x3ab743ce;
        auVar100._16_4_ = 0x3ab743ce;
        auVar100._20_4_ = 0x3ab743ce;
        auVar100._24_4_ = 0x3ab743ce;
        auVar100._28_4_ = 0x3ab743ce;
        auVar149._8_4_ = 0x39506967;
        auVar149._0_8_ = 0x3950696739506967;
        auVar149._12_4_ = 0x39506967;
        auVar149._16_4_ = 0x39506967;
        auVar149._20_4_ = 0x39506967;
        auVar149._24_4_ = 0x39506967;
        auVar149._28_4_ = 0x39506967;
        auVar127._8_4_ = 0x3c088908;
        auVar127._0_8_ = 0x3c0889083c088908;
        auVar127._12_4_ = 0x3c088908;
        auVar127._16_4_ = 0x3c088908;
        auVar127._20_4_ = 0x3c088908;
        auVar127._24_4_ = 0x3c088908;
        auVar127._28_4_ = 0x3c088908;
        auVar130._8_4_ = 0x3d2aa9c1;
        auVar130._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar130._12_4_ = 0x3d2aa9c1;
        auVar130._16_4_ = 0x3d2aa9c1;
        auVar130._20_4_ = 0x3d2aa9c1;
        auVar130._24_4_ = 0x3d2aa9c1;
        auVar130._28_4_ = 0x3d2aa9c1;
        auVar134._8_4_ = 0x3e2aaaaa;
        auVar134._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar134._12_4_ = 0x3e2aaaaa;
        auVar134._16_4_ = 0x3e2aaaaa;
        auVar134._20_4_ = 0x3e2aaaaa;
        auVar134._24_4_ = 0x3e2aaaaa;
        auVar134._28_4_ = 0x3e2aaaaa;
        auVar138._8_4_ = 0x3f800000;
        auVar138._0_8_ = 0x3f8000003f800000;
        auVar138._12_4_ = 0x3f800000;
        auVar138._16_4_ = 0x3f800000;
        auVar138._20_4_ = 0x3f800000;
        auVar138._24_4_ = 0x3f800000;
        auVar138._28_4_ = 0x3f800000;
        auVar62 = vpbroadcastd_avx512vl(ZEXT416(0xffffff82));
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar76 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar73 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar71 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar67 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar66 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar65 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar63 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        do {
          if (0 < (int)uVar19) {
            pauVar21 = (undefined1 (*) [32])
                       (bottom_top_blob->cstep * uVar15 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            uVar18 = uVar19;
            do {
              auVar55 = vminps_avx512vl(*pauVar21,auVar68);
              auVar56 = vmaxps_avx512vl(auVar55,auVar69);
              auVar57 = vfmadd213ps_avx512vl(auVar109,auVar56,auVar70);
              auVar55 = vroundps_avx(auVar57,1);
              uVar2 = vcmpps_avx512vl(auVar57,auVar55,1);
              auVar57 = vsubps_avx512vl(auVar55,auVar80);
              bVar1 = (bool)((byte)uVar2 & 1);
              auVar122._0_4_ = (float)((uint)bVar1 * auVar57._0_4_ | (uint)!bVar1 * auVar55._0_4_);
              bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
              auVar122._4_4_ = (float)((uint)bVar1 * auVar57._4_4_ | (uint)!bVar1 * auVar55._4_4_);
              bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
              auVar122._8_4_ = (float)((uint)bVar1 * auVar57._8_4_ | (uint)!bVar1 * auVar55._8_4_);
              bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
              auVar122._12_4_ =
                   (float)((uint)bVar1 * auVar57._12_4_ | (uint)!bVar1 * auVar55._12_4_);
              bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
              auVar122._16_4_ =
                   (float)((uint)bVar1 * auVar57._16_4_ | (uint)!bVar1 * auVar55._16_4_);
              bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
              auVar122._20_4_ =
                   (float)((uint)bVar1 * auVar57._20_4_ | (uint)!bVar1 * auVar55._20_4_);
              bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
              auVar122._24_4_ =
                   (float)((uint)bVar1 * auVar57._24_4_ | (uint)!bVar1 * auVar55._24_4_);
              bVar1 = SUB81(uVar2 >> 7,0);
              auVar122._28_4_ =
                   (float)((uint)bVar1 * auVar57._28_4_ | (uint)!bVar1 * auVar55._28_4_);
              auVar55 = vfmsub231ps_avx512vl(auVar56,auVar122,auVar81);
              auVar55 = vfnmsub231ps_avx512vl(auVar55,auVar122,auVar78);
              auVar56 = vmulps_avx512vl(auVar55,auVar55);
              auVar57 = vfmadd213ps_avx512vl(auVar149,auVar55,auVar100);
              auVar57 = vfmadd213ps_avx512vl(auVar57,auVar55,auVar127);
              auVar57 = vfmadd213ps_avx512vl(auVar57,auVar55,auVar130);
              auVar57 = vfmadd213ps_avx512vl(auVar57,auVar55,auVar134);
              auVar57 = vfmadd213ps_avx512vl(auVar57,auVar55,auVar70);
              auVar55 = vfmadd213ps_avx512vl(auVar57,auVar56,auVar55);
              auVar106._0_4_ = auVar55._0_4_ + 1.0;
              auVar106._4_4_ = auVar55._4_4_ + 1.0;
              auVar106._8_4_ = auVar55._8_4_ + 1.0;
              auVar106._12_4_ = auVar55._12_4_ + 1.0;
              auVar106._16_4_ = auVar55._16_4_ + 1.0;
              auVar106._20_4_ = auVar55._20_4_ + 1.0;
              auVar106._24_4_ = auVar55._24_4_ + 1.0;
              auVar106._28_4_ = auVar55._28_4_ + 1.0;
              auVar121._0_4_ = (int)auVar122._0_4_;
              auVar121._4_4_ = (int)auVar122._4_4_;
              auVar121._8_4_ = (int)auVar122._8_4_;
              auVar121._12_4_ = (int)auVar122._12_4_;
              auVar121._16_4_ = (int)auVar122._16_4_;
              auVar121._20_4_ = (int)auVar122._20_4_;
              auVar121._24_4_ = (int)auVar122._24_4_;
              auVar121._28_4_ = (int)auVar122._28_4_;
              auVar55 = vpslld_avx2(auVar121,0x17);
              auVar55 = vpaddd_avx2(auVar55,auVar138);
              auVar23 = vfmadd213ps_fma(auVar55,auVar106,auVar80);
              uVar2 = vcmpps_avx512vl(ZEXT1632(auVar23),auVar151._0_32_,2);
              auVar55._8_4_ = 0x800000;
              auVar55._0_8_ = 0x80000000800000;
              auVar55._12_4_ = 0x800000;
              auVar55._16_4_ = 0x800000;
              auVar55._20_4_ = 0x800000;
              auVar55._24_4_ = 0x800000;
              auVar55._28_4_ = 0x800000;
              auVar55 = vmaxps_avx512vl(ZEXT1632(auVar23),auVar55);
              auVar122 = vpsrld_avx2(auVar55,0x17);
              auVar145._8_4_ = 0x807fffff;
              auVar145._0_8_ = 0x807fffff807fffff;
              auVar145._12_4_ = 0x807fffff;
              auVar145._16_4_ = 0x807fffff;
              auVar145._20_4_ = 0x807fffff;
              auVar145._24_4_ = 0x807fffff;
              auVar145._28_4_ = 0x807fffff;
              auVar56._8_4_ = 0x3f000000;
              auVar56._0_8_ = 0x3f0000003f000000;
              auVar56._12_4_ = 0x3f000000;
              auVar56._16_4_ = 0x3f000000;
              auVar56._20_4_ = 0x3f000000;
              auVar56._24_4_ = 0x3f000000;
              auVar56._28_4_ = 0x3f000000;
              auVar55 = vpternlogd_avx512vl(auVar55,auVar145,auVar56,0xea);
              uVar3 = vcmpps_avx512vl(auVar55,auVar75,1);
              auVar56 = vaddps_avx512vl(auVar55,auVar77);
              auVar57 = vaddps_avx512vl(auVar56,auVar55);
              bVar1 = (bool)((byte)uVar3 & 1);
              auVar58._0_4_ = (float)((uint)bVar1 * auVar57._0_4_ | (uint)!bVar1 * auVar56._0_4_);
              bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
              auVar58._4_4_ = (float)((uint)bVar1 * auVar57._4_4_ | (uint)!bVar1 * auVar56._4_4_);
              bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
              auVar58._8_4_ = (float)((uint)bVar1 * auVar57._8_4_ | (uint)!bVar1 * auVar56._8_4_);
              bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
              auVar58._12_4_ = (float)((uint)bVar1 * auVar57._12_4_ | (uint)!bVar1 * auVar56._12_4_)
              ;
              bVar1 = (bool)((byte)(uVar3 >> 4) & 1);
              auVar58._16_4_ = (float)((uint)bVar1 * auVar57._16_4_ | (uint)!bVar1 * auVar56._16_4_)
              ;
              bVar1 = (bool)((byte)(uVar3 >> 5) & 1);
              auVar58._20_4_ = (float)((uint)bVar1 * auVar57._20_4_ | (uint)!bVar1 * auVar56._20_4_)
              ;
              bVar1 = (bool)((byte)(uVar3 >> 6) & 1);
              auVar58._24_4_ = (float)((uint)bVar1 * auVar57._24_4_ | (uint)!bVar1 * auVar56._24_4_)
              ;
              bVar1 = SUB81(uVar3 >> 7,0);
              auVar58._28_4_ = (uint)bVar1 * auVar57._28_4_ | (uint)!bVar1 * auVar56._28_4_;
              auVar57._4_4_ = auVar58._4_4_ * auVar58._4_4_;
              auVar57._0_4_ = auVar58._0_4_ * auVar58._0_4_;
              auVar57._8_4_ = auVar58._8_4_ * auVar58._8_4_;
              auVar57._12_4_ = auVar58._12_4_ * auVar58._12_4_;
              auVar57._16_4_ = auVar58._16_4_ * auVar58._16_4_;
              auVar57._20_4_ = auVar58._20_4_ * auVar58._20_4_;
              auVar57._24_4_ = auVar58._24_4_ * auVar58._24_4_;
              auVar57._28_4_ = auVar55._28_4_;
              auVar55 = vfmadd213ps_avx512vl(auVar74,auVar58,auVar73);
              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar71);
              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar67);
              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar66);
              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar65);
              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar64);
              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar63);
              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar58,auVar72);
              auVar56 = vmulps_avx512vl(auVar57,auVar58);
              auVar56 = vmulps_avx512vl(auVar56,auVar55);
              auVar55 = vpaddd_avx512vl(auVar122,auVar62);
              auVar55 = vcvtdq2ps_avx(auVar55);
              auVar122 = vsubps_avx512vl(auVar55,auVar80);
              bVar1 = (bool)((byte)uVar3 & 1);
              auVar59._0_4_ = (uint)bVar1 * auVar122._0_4_ | (uint)!bVar1 * auVar55._0_4_;
              bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
              auVar59._4_4_ = (uint)bVar1 * auVar122._4_4_ | (uint)!bVar1 * auVar55._4_4_;
              bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
              auVar59._8_4_ = (uint)bVar1 * auVar122._8_4_ | (uint)!bVar1 * auVar55._8_4_;
              bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
              auVar59._12_4_ = (uint)bVar1 * auVar122._12_4_ | (uint)!bVar1 * auVar55._12_4_;
              bVar1 = (bool)((byte)(uVar3 >> 4) & 1);
              auVar59._16_4_ = (uint)bVar1 * auVar122._16_4_ | (uint)!bVar1 * auVar55._16_4_;
              bVar1 = (bool)((byte)(uVar3 >> 5) & 1);
              auVar59._20_4_ = (uint)bVar1 * auVar122._20_4_ | (uint)!bVar1 * auVar55._20_4_;
              bVar1 = (bool)((byte)(uVar3 >> 6) & 1);
              auVar59._24_4_ = (uint)bVar1 * auVar122._24_4_ | (uint)!bVar1 * auVar55._24_4_;
              bVar1 = SUB81(uVar3 >> 7,0);
              auVar59._28_4_ = (uint)bVar1 * auVar122._28_4_ | (uint)!bVar1 * auVar55._28_4_;
              auVar55 = vfmadd231ps_avx512vl(auVar56,auVar59,auVar78);
              auVar55 = vfmsub231ps_avx512vl(auVar55,auVar70,auVar57);
              auVar55 = vsubps_avx512vl(auVar55,auVar58);
              auVar23 = vfmsub231ps_fma(auVar55,auVar81,auVar59);
              auVar55 = vmulps_avx512vl(ZEXT1632(auVar23),auVar76);
              auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              bVar1 = (bool)((byte)uVar2 & 1);
              auVar60._0_4_ = (uint)bVar1 * auVar56._0_4_ | (uint)!bVar1 * auVar55._0_4_;
              bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
              auVar60._4_4_ = (uint)bVar1 * auVar56._4_4_ | (uint)!bVar1 * auVar55._4_4_;
              bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
              auVar60._8_4_ = (uint)bVar1 * auVar56._8_4_ | (uint)!bVar1 * auVar55._8_4_;
              bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
              auVar60._12_4_ = (uint)bVar1 * auVar56._12_4_ | (uint)!bVar1 * auVar55._12_4_;
              bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
              auVar60._16_4_ = (uint)bVar1 * auVar56._16_4_ | (uint)!bVar1 * auVar55._16_4_;
              bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
              auVar60._20_4_ = (uint)bVar1 * auVar56._20_4_ | (uint)!bVar1 * auVar55._20_4_;
              bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
              auVar60._24_4_ = (uint)bVar1 * auVar56._24_4_ | (uint)!bVar1 * auVar55._24_4_;
              bVar1 = SUB81(uVar2 >> 7,0);
              auVar60._28_4_ = (uint)bVar1 * auVar56._28_4_ | (uint)!bVar1 * auVar55._28_4_;
              auVar55 = vminps_avx(auVar60,auVar68);
              auVar55 = vmaxps_avx(auVar55,auVar69);
              auVar23 = vfmadd213ps_fma(auVar109,auVar55,auVar70);
              auVar56 = vroundps_avx(ZEXT1632(auVar23),1);
              uVar2 = vcmpps_avx512vl(ZEXT1632(auVar23),auVar56,1);
              auVar57 = vsubps_avx512vl(auVar56,auVar80);
              bVar1 = (bool)((byte)uVar2 & 1);
              auVar61._0_4_ = (float)((uint)bVar1 * auVar57._0_4_ | (uint)!bVar1 * auVar56._0_4_);
              bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
              auVar61._4_4_ = (float)((uint)bVar1 * auVar57._4_4_ | (uint)!bVar1 * auVar56._4_4_);
              bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
              auVar61._8_4_ = (float)((uint)bVar1 * auVar57._8_4_ | (uint)!bVar1 * auVar56._8_4_);
              bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
              auVar61._12_4_ = (float)((uint)bVar1 * auVar57._12_4_ | (uint)!bVar1 * auVar56._12_4_)
              ;
              bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
              auVar61._16_4_ = (float)((uint)bVar1 * auVar57._16_4_ | (uint)!bVar1 * auVar56._16_4_)
              ;
              bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
              auVar61._20_4_ = (float)((uint)bVar1 * auVar57._20_4_ | (uint)!bVar1 * auVar56._20_4_)
              ;
              bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
              auVar61._24_4_ = (float)((uint)bVar1 * auVar57._24_4_ | (uint)!bVar1 * auVar56._24_4_)
              ;
              bVar1 = SUB81(uVar2 >> 7,0);
              auVar61._28_4_ = (float)((uint)bVar1 * auVar57._28_4_ | (uint)!bVar1 * auVar56._28_4_)
              ;
              auVar23 = vfmsub231ps_fma(auVar55,auVar61,auVar81);
              auVar23 = vfnmsub231ps_fma(ZEXT1632(auVar23),auVar61,auVar78);
              auVar56 = ZEXT1632(auVar23);
              auVar55 = vfmadd213ps_avx512vl(auVar149,auVar56,auVar100);
              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar56,auVar127);
              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar56,auVar130);
              auVar56 = ZEXT1632(auVar23);
              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar56,auVar134);
              auVar55 = vfmadd213ps_avx512vl(auVar55,auVar56,auVar70);
              auVar55 = vfmadd213ps_avx512vl
                                  (auVar55,ZEXT1632(CONCAT412(auVar23._12_4_ * auVar23._12_4_,
                                                              CONCAT48(auVar23._8_4_ * auVar23._8_4_
                                                                       ,CONCAT44(auVar23._4_4_ *
                                                                                 auVar23._4_4_,
                                                                                 auVar23._0_4_ *
                                                                                 auVar23._0_4_)))),
                                   auVar56);
              auVar56 = vaddps_avx512vl(auVar55,auVar80);
              auVar23 = vxorps_avx512vl(auVar55._0_16_,auVar55._0_16_);
              auVar151 = ZEXT1664(auVar23);
              auVar123._0_4_ = (int)auVar61._0_4_;
              auVar123._4_4_ = (int)auVar61._4_4_;
              auVar123._8_4_ = (int)auVar61._8_4_;
              auVar123._12_4_ = (int)auVar61._12_4_;
              auVar123._16_4_ = (int)auVar61._16_4_;
              auVar123._20_4_ = (int)auVar61._20_4_;
              auVar123._24_4_ = (int)auVar61._24_4_;
              auVar123._28_4_ = (int)auVar61._28_4_;
              auVar55 = vpslld_avx2(auVar123,0x17);
              auVar55 = vpaddd_avx2(auVar55,auVar138);
              auVar23 = vfmadd213ps_fma(auVar55,auVar56,auVar80);
              auVar55 = vrcpps_avx(ZEXT1632(auVar23));
              auVar23 = vfmsub213ps_fma(ZEXT1632(auVar23),auVar55,auVar80);
              auVar23 = vfnmadd132ps_fma(ZEXT1632(auVar23),auVar55,auVar55);
              auVar55 = vfnmadd213ps_avx512vl(ZEXT1632(auVar23),auVar76,auVar77);
              auVar55 = vmulps_avx512vl(auVar55,*pauVar21);
              *pauVar21 = auVar55;
              pauVar21 = pauVar21 + 1;
              uVar18 = uVar18 - 1;
            } while (uVar18 != 0);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar20);
      }
    }
    else if (iVar14 == 4) {
      if (0 < (int)uVar18) {
        auVar45._8_4_ = 0x42b0c0a5;
        auVar45._0_8_ = 0x42b0c0a542b0c0a5;
        auVar45._12_4_ = 0x42b0c0a5;
        auVar46._8_4_ = 0xc2b0c0a5;
        auVar46._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar46._12_4_ = 0xc2b0c0a5;
        auVar107._8_4_ = 0x3fb8aa3b;
        auVar107._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar107._12_4_ = 0x3fb8aa3b;
        auVar47._8_4_ = 0x3f000000;
        auVar47._0_8_ = 0x3f0000003f000000;
        auVar47._12_4_ = 0x3f000000;
        uVar15 = 0;
        auVar23 = vxorps_avx512vl(auVar23,auVar23);
        auVar151 = ZEXT1664(auVar23);
        auVar110._8_4_ = 0x3f800000;
        auVar110._0_8_ = 0x3f8000003f800000;
        auVar110._12_4_ = 0x3f800000;
        auVar112._8_4_ = 0x3f318000;
        auVar112._0_8_ = 0x3f3180003f318000;
        auVar112._12_4_ = 0x3f318000;
        auVar114._8_4_ = 0xb95e8083;
        auVar114._0_8_ = 0xb95e8083b95e8083;
        auVar114._12_4_ = 0xb95e8083;
        auVar116._8_4_ = 0x3ab743ce;
        auVar116._0_8_ = 0x3ab743ce3ab743ce;
        auVar116._12_4_ = 0x3ab743ce;
        auVar147._8_4_ = 0x39506967;
        auVar147._0_8_ = 0x3950696739506967;
        auVar147._12_4_ = 0x39506967;
        auVar125._8_4_ = 0x3c088908;
        auVar125._0_8_ = 0x3c0889083c088908;
        auVar125._12_4_ = 0x3c088908;
        auVar128._8_4_ = 0x3d2aa9c1;
        auVar128._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar128._12_4_ = 0x3d2aa9c1;
        auVar132._8_4_ = 0x3e2aaaaa;
        auVar132._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar132._12_4_ = 0x3e2aaaaa;
        auVar136._8_4_ = 0x3f800000;
        auVar136._0_8_ = 0x3f8000003f800000;
        auVar136._12_4_ = 0x3f800000;
        auVar23 = vpbroadcastd_avx512vl(ZEXT416(0xffffff82));
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        auVar25 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar26 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar27 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar28 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar29 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar31 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar32 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar33 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar34 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar35 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        do {
          if (0 < (int)uVar19) {
            pauVar17 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * uVar15 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            uVar18 = uVar19;
            do {
              auVar44 = *pauVar17;
              auVar36 = vminps_avx512vl(auVar44,auVar45);
              auVar37 = vmaxps_avx512vl(auVar36,auVar46);
              auVar38 = vfmadd213ps_avx512vl(auVar107,auVar37,auVar47);
              auVar140._0_4_ = (int)auVar38._0_4_;
              auVar140._4_4_ = (int)auVar38._4_4_;
              auVar140._8_4_ = (int)auVar38._8_4_;
              auVar140._12_4_ = (int)auVar38._12_4_;
              auVar36 = vcvtdq2ps_avx(auVar140);
              uVar2 = vcmpps_avx512vl(auVar38,auVar36,1);
              auVar38 = vsubps_avx512vl(auVar36,auVar110);
              bVar1 = (bool)((byte)uVar2 & 1);
              auVar39._0_4_ = (float)((uint)bVar1 * auVar38._0_4_ | (uint)!bVar1 * auVar36._0_4_);
              bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
              auVar39._4_4_ = (float)((uint)bVar1 * auVar38._4_4_ | (uint)!bVar1 * auVar36._4_4_);
              bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
              auVar39._8_4_ = (float)((uint)bVar1 * auVar38._8_4_ | (uint)!bVar1 * auVar36._8_4_);
              bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
              auVar39._12_4_ = (float)((uint)bVar1 * auVar38._12_4_ | (uint)!bVar1 * auVar36._12_4_)
              ;
              auVar36 = vfmsub231ps_avx512vl(auVar37,auVar39,auVar112);
              auVar36 = vfnmsub231ps_avx512vl(auVar36,auVar39,auVar114);
              auVar37 = vmulps_avx512vl(auVar36,auVar36);
              auVar38 = vfmadd213ps_avx512vl(auVar147,auVar36,auVar116);
              auVar38 = vfmadd213ps_avx512vl(auVar38,auVar36,auVar125);
              auVar38 = vfmadd213ps_avx512vl(auVar38,auVar36,auVar128);
              auVar38 = vfmadd213ps_avx512vl(auVar38,auVar36,auVar132);
              auVar38 = vfmadd213ps_avx512vl(auVar38,auVar36,auVar47);
              auVar36 = vfmadd213ps_avx512vl(auVar38,auVar37,auVar36);
              auVar92._0_4_ = auVar36._0_4_ + 1.0;
              auVar92._4_4_ = auVar36._4_4_ + 1.0;
              auVar92._8_4_ = auVar36._8_4_ + 1.0;
              auVar92._12_4_ = auVar36._12_4_ + 1.0;
              auVar118._0_4_ = (int)auVar39._0_4_;
              auVar118._4_4_ = (int)auVar39._4_4_;
              auVar118._8_4_ = (int)auVar39._8_4_;
              auVar118._12_4_ = (int)auVar39._12_4_;
              auVar36 = vpslld_avx(auVar118,0x17);
              auVar36 = vpaddd_avx(auVar36,auVar136);
              auVar36 = vfmadd213ps_fma(auVar36,auVar92,auVar110);
              uVar2 = vcmpps_avx512vl(auVar36,auVar151._0_16_,2);
              auVar4._8_4_ = 0x800000;
              auVar4._0_8_ = 0x80000000800000;
              auVar4._12_4_ = 0x800000;
              auVar36 = vmaxps_avx512vl(auVar36,auVar4);
              auVar38 = vpsrld_avx(auVar36,0x17);
              auVar141._8_4_ = 0x807fffff;
              auVar141._0_8_ = 0x807fffff807fffff;
              auVar141._12_4_ = 0x807fffff;
              auVar5._8_4_ = 0x3f000000;
              auVar5._0_8_ = 0x3f0000003f000000;
              auVar5._12_4_ = 0x3f000000;
              auVar36 = vpternlogd_avx512vl(auVar36,auVar141,auVar5,0xea);
              uVar3 = vcmpps_avx512vl(auVar36,auVar25,1);
              auVar37 = vaddps_avx512vl(auVar36,auVar26);
              auVar36 = vaddps_avx512vl(auVar37,auVar36);
              bVar1 = (bool)((byte)uVar3 & 1);
              auVar40._0_4_ = (float)((uint)bVar1 * auVar36._0_4_ | (uint)!bVar1 * auVar37._0_4_);
              bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
              auVar40._4_4_ = (float)((uint)bVar1 * auVar36._4_4_ | (uint)!bVar1 * auVar37._4_4_);
              bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
              auVar40._8_4_ = (float)((uint)bVar1 * auVar36._8_4_ | (uint)!bVar1 * auVar37._8_4_);
              bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
              auVar40._12_4_ = (float)((uint)bVar1 * auVar36._12_4_ | (uint)!bVar1 * auVar37._12_4_)
              ;
              auVar93._0_4_ = auVar40._0_4_ * auVar40._0_4_;
              auVar93._4_4_ = auVar40._4_4_ * auVar40._4_4_;
              auVar93._8_4_ = auVar40._8_4_ * auVar40._8_4_;
              auVar93._12_4_ = auVar40._12_4_ * auVar40._12_4_;
              auVar36 = vfmadd213ps_avx512vl(auVar27,auVar40,auVar28);
              auVar36 = vfmadd213ps_avx512vl(auVar36,auVar40,auVar29);
              auVar36 = vfmadd213ps_avx512vl(auVar36,auVar40,auVar30);
              auVar36 = vfmadd213ps_avx512vl(auVar36,auVar40,auVar31);
              auVar36 = vfmadd213ps_avx512vl(auVar36,auVar40,auVar32);
              auVar36 = vfmadd213ps_avx512vl(auVar36,auVar40,auVar33);
              auVar36 = vfmadd213ps_avx512vl(auVar36,auVar40,auVar34);
              auVar36 = vfmadd213ps_avx512vl(auVar36,auVar40,auVar35);
              auVar37 = vmulps_avx512vl(auVar93,auVar40);
              auVar37 = vmulps_avx512vl(auVar37,auVar36);
              auVar36 = vpaddd_avx512vl(auVar38,auVar23);
              auVar36 = vcvtdq2ps_avx(auVar36);
              auVar38 = vsubps_avx512vl(auVar36,auVar110);
              bVar1 = (bool)((byte)uVar3 & 1);
              auVar41._0_4_ = (uint)bVar1 * auVar38._0_4_ | (uint)!bVar1 * auVar36._0_4_;
              bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
              auVar41._4_4_ = (uint)bVar1 * auVar38._4_4_ | (uint)!bVar1 * auVar36._4_4_;
              bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
              auVar41._8_4_ = (uint)bVar1 * auVar38._8_4_ | (uint)!bVar1 * auVar36._8_4_;
              bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
              auVar41._12_4_ = (uint)bVar1 * auVar38._12_4_ | (uint)!bVar1 * auVar36._12_4_;
              auVar36 = vfmadd231ps_avx512vl(auVar37,auVar41,auVar114);
              auVar36 = vfmsub231ps_avx512vl(auVar36,auVar47,auVar93);
              auVar36 = vsubps_avx512vl(auVar36,auVar40);
              auVar36 = vfnmadd231ps_fma(auVar36,auVar112,auVar41);
              auVar37 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              bVar1 = (bool)((byte)uVar2 & 1);
              auVar42._0_4_ =
                   (uint)bVar1 * auVar37._0_4_ | (uint)!bVar1 * (int)(auVar36._0_4_ + auVar36._0_4_)
              ;
              bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
              auVar42._4_4_ =
                   (uint)bVar1 * auVar37._4_4_ | (uint)!bVar1 * (int)(auVar36._4_4_ + auVar36._4_4_)
              ;
              bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
              auVar42._8_4_ =
                   (uint)bVar1 * auVar37._8_4_ | (uint)!bVar1 * (int)(auVar36._8_4_ + auVar36._8_4_)
              ;
              bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
              auVar42._12_4_ =
                   (uint)bVar1 * auVar37._12_4_ |
                   (uint)!bVar1 * (int)(auVar36._12_4_ + auVar36._12_4_);
              auVar36 = vminps_avx(auVar42,auVar45);
              auVar37 = vmaxps_avx(auVar36,auVar46);
              auVar38 = vfmadd213ps_fma(auVar107,auVar37,auVar47);
              auVar142._0_4_ = (int)auVar38._0_4_;
              auVar142._4_4_ = (int)auVar38._4_4_;
              auVar142._8_4_ = (int)auVar38._8_4_;
              auVar142._12_4_ = (int)auVar38._12_4_;
              auVar36 = vcvtdq2ps_avx(auVar142);
              uVar2 = vcmpps_avx512vl(auVar38,auVar36,1);
              auVar38 = vsubps_avx512vl(auVar36,auVar110);
              bVar1 = (bool)((byte)uVar2 & 1);
              auVar43._0_4_ = (float)((uint)bVar1 * auVar38._0_4_ | (uint)!bVar1 * auVar36._0_4_);
              bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
              auVar43._4_4_ = (float)((uint)bVar1 * auVar38._4_4_ | (uint)!bVar1 * auVar36._4_4_);
              bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
              auVar43._8_4_ = (float)((uint)bVar1 * auVar38._8_4_ | (uint)!bVar1 * auVar36._8_4_);
              bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
              auVar43._12_4_ = (float)((uint)bVar1 * auVar38._12_4_ | (uint)!bVar1 * auVar36._12_4_)
              ;
              auVar36 = vfmsub231ps_fma(auVar37,auVar43,auVar112);
              auVar36 = vfnmsub231ps_fma(auVar36,auVar43,auVar114);
              auVar119._0_4_ = auVar36._0_4_ * auVar36._0_4_;
              auVar119._4_4_ = auVar36._4_4_ * auVar36._4_4_;
              auVar119._8_4_ = auVar36._8_4_ * auVar36._8_4_;
              auVar119._12_4_ = auVar36._12_4_ * auVar36._12_4_;
              auVar37 = vfmadd213ps_avx512vl(auVar147,auVar36,auVar116);
              auVar37 = vfmadd213ps_avx512vl(auVar37,auVar36,auVar125);
              auVar37 = vfmadd213ps_avx512vl(auVar37,auVar36,auVar128);
              auVar37 = vfmadd213ps_avx512vl(auVar37,auVar36,auVar132);
              auVar37 = vfmadd213ps_avx512vl(auVar37,auVar36,auVar47);
              auVar36 = vfmadd213ps_avx512vl(auVar37,auVar119,auVar36);
              auVar37 = vaddps_avx512vl(auVar36,auVar110);
              auVar36 = vxorps_avx512vl(auVar36,auVar36);
              auVar151 = ZEXT1664(auVar36);
              auVar120._0_4_ = (int)auVar43._0_4_;
              auVar120._4_4_ = (int)auVar43._4_4_;
              auVar120._8_4_ = (int)auVar43._8_4_;
              auVar120._12_4_ = (int)auVar43._12_4_;
              auVar36 = vpslld_avx(auVar120,0x17);
              auVar36 = vpaddd_avx(auVar36,auVar136);
              auVar37 = vfmadd213ps_fma(auVar36,auVar37,auVar110);
              auVar36 = vrcpps_avx(auVar37);
              auVar143._0_4_ = auVar36._0_4_ + auVar36._0_4_;
              auVar143._4_4_ = auVar36._4_4_ + auVar36._4_4_;
              auVar143._8_4_ = auVar36._8_4_ + auVar36._8_4_;
              auVar143._12_4_ = auVar36._12_4_ + auVar36._12_4_;
              auVar37 = vfmsub213ps_avx512vl(auVar37,auVar143,auVar24);
              auVar36 = vfnmadd213ps_fma(auVar37,auVar36,auVar143);
              auVar44 = vfmsub213ps_avx512vl(auVar36,auVar44,auVar44);
              *pauVar17 = auVar44;
              pauVar17 = pauVar17 + 1;
              uVar18 = uVar18 - 1;
            } while (uVar18 != 0);
          }
          uVar15 = uVar15 + 1;
        } while (uVar15 != uVar20);
      }
    }
    else if (0 < (int)uVar18) {
      uVar15 = 0;
      auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar65 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      auVar66 = vbroadcastss_avx512vl(ZEXT416(0x800000));
      auVar67 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
      auVar68 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
      auVar69 = vpbroadcastd_avx512vl(ZEXT416(0xffffff82));
      auVar70 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
      auVar71 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
      auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
      auVar73 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
      auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
      auVar75 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
      auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
      auVar77 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      do {
        auVar150._8_4_ = 0x39506967;
        auVar150._0_8_ = 0x3950696739506967;
        auVar146._8_4_ = 0x3ab743ce;
        auVar146._0_8_ = 0x3ab743ce3ab743ce;
        auVar139._8_4_ = 0xb95e8083;
        auVar139._0_8_ = 0xb95e8083b95e8083;
        auVar135._8_4_ = 0x3f318000;
        auVar135._0_8_ = 0x3f3180003f318000;
        auVar131._8_4_ = 0x3f800000;
        auVar131._0_8_ = 0x3f8000003f800000;
        auVar124._8_4_ = 0x3fb8aa3b;
        auVar124._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar117._8_4_ = 0x3f000000;
        auVar117._0_8_ = 0x3f0000003f000000;
        auVar115._8_4_ = 0xc2b0c0a5;
        auVar115._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar113._8_4_ = 0x42b0c0a5;
        auVar113._0_8_ = 0x42b0c0a542b0c0a5;
        auVar150._12_4_ = 0x39506967;
        auVar146._12_4_ = 0x3ab743ce;
        auVar139._12_4_ = 0xb95e8083;
        auVar135._12_4_ = 0x3f318000;
        auVar131._12_4_ = 0x3f800000;
        auVar124._12_4_ = 0x3fb8aa3b;
        auVar117._12_4_ = 0x3f000000;
        auVar115._12_4_ = 0xc2b0c0a5;
        auVar113._12_4_ = 0x42b0c0a5;
        auVar150._16_4_ = 0x39506967;
        auVar146._16_4_ = 0x3ab743ce;
        auVar139._16_4_ = 0xb95e8083;
        auVar135._16_4_ = 0x3f318000;
        auVar131._16_4_ = 0x3f800000;
        auVar124._16_4_ = 0x3fb8aa3b;
        auVar117._16_4_ = 0x3f000000;
        auVar115._16_4_ = 0xc2b0c0a5;
        auVar113._16_4_ = 0x42b0c0a5;
        auVar150._20_4_ = 0x39506967;
        auVar146._20_4_ = 0x3ab743ce;
        auVar139._20_4_ = 0xb95e8083;
        auVar135._20_4_ = 0x3f318000;
        auVar131._20_4_ = 0x3f800000;
        auVar124._20_4_ = 0x3fb8aa3b;
        auVar117._20_4_ = 0x3f000000;
        auVar115._20_4_ = 0xc2b0c0a5;
        auVar113._20_4_ = 0x42b0c0a5;
        auVar150._24_4_ = 0x39506967;
        auVar146._24_4_ = 0x3ab743ce;
        auVar139._24_4_ = 0xb95e8083;
        auVar135._24_4_ = 0x3f318000;
        auVar131._24_4_ = 0x3f800000;
        auVar124._24_4_ = 0x3fb8aa3b;
        auVar117._24_4_ = 0x3f000000;
        auVar115._24_4_ = 0xc2b0c0a5;
        auVar113._24_4_ = 0x42b0c0a5;
        auVar150._28_4_ = 0x39506967;
        auVar146._28_4_ = 0x3ab743ce;
        auVar139._28_4_ = 0xb95e8083;
        auVar135._28_4_ = 0x3f318000;
        auVar131._28_4_ = 0x3f800000;
        auVar124._28_4_ = 0x3fb8aa3b;
        auVar117._28_4_ = 0x3f000000;
        auVar115._28_4_ = 0xc2b0c0a5;
        auVar113._28_4_ = 0x42b0c0a5;
        pauVar21 = (undefined1 (*) [32])
                   (bottom_top_blob->cstep * uVar15 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar19 < 8) {
          uVar18 = 0;
        }
        else {
          iVar14 = 7;
          do {
            auVar111._8_4_ = 0x3e4cceac;
            auVar111._0_8_ = 0x3e4cceac3e4cceac;
            auVar111._12_4_ = 0x3e4cceac;
            auVar111._16_4_ = 0x3e4cceac;
            auVar111._20_4_ = 0x3e4cceac;
            auVar111._24_4_ = 0x3e4cceac;
            auVar111._28_4_ = 0x3e4cceac;
            auVar109 = *pauVar21;
            auVar80 = vminps_avx(auVar109,auVar113);
            auVar80 = vmaxps_avx(auVar80,auVar115);
            auVar23 = vfmadd213ps_fma(auVar124,auVar80,auVar117);
            auVar81 = vroundps_avx(ZEXT1632(auVar23),1);
            uVar2 = vcmpps_avx512vl(ZEXT1632(auVar23),auVar81,1);
            auVar78 = vsubps_avx512vl(auVar81,auVar131);
            bVar1 = (bool)((byte)uVar2 & 1);
            auVar79._0_4_ = (float)((uint)bVar1 * auVar78._0_4_ | (uint)!bVar1 * auVar81._0_4_);
            bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
            auVar79._4_4_ = (float)((uint)bVar1 * auVar78._4_4_ | (uint)!bVar1 * auVar81._4_4_);
            bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
            auVar79._8_4_ = (float)((uint)bVar1 * auVar78._8_4_ | (uint)!bVar1 * auVar81._8_4_);
            bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
            auVar79._12_4_ = (float)((uint)bVar1 * auVar78._12_4_ | (uint)!bVar1 * auVar81._12_4_);
            bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
            auVar79._16_4_ = (float)((uint)bVar1 * auVar78._16_4_ | (uint)!bVar1 * auVar81._16_4_);
            bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
            auVar79._20_4_ = (float)((uint)bVar1 * auVar78._20_4_ | (uint)!bVar1 * auVar81._20_4_);
            bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
            auVar79._24_4_ = (float)((uint)bVar1 * auVar78._24_4_ | (uint)!bVar1 * auVar81._24_4_);
            bVar1 = SUB81(uVar2 >> 7,0);
            auVar79._28_4_ = (float)((uint)bVar1 * auVar78._28_4_ | (uint)!bVar1 * auVar81._28_4_);
            auVar23 = vfmsub231ps_fma(auVar80,auVar79,auVar135);
            auVar24 = vfnmsub231ps_fma(ZEXT1632(auVar23),auVar79,auVar139);
            auVar81 = ZEXT1632(auVar24);
            auVar23 = vfmadd213ps_fma(auVar150,auVar81,auVar146);
            auVar80 = vfmadd213ps_avx512vl(ZEXT1632(auVar23),auVar81,auVar62);
            auVar80 = vfmadd213ps_avx512vl(auVar80,auVar81,auVar63);
            auVar81 = ZEXT1632(auVar24);
            auVar80 = vfmadd213ps_avx512vl(auVar80,auVar81,auVar64);
            auVar23 = vfmadd213ps_fma(auVar80,auVar81,auVar117);
            auVar23 = vfmadd213ps_fma(ZEXT1632(auVar23),
                                      ZEXT1632(CONCAT412(auVar24._12_4_ * auVar24._12_4_,
                                                         CONCAT48(auVar24._8_4_ * auVar24._8_4_,
                                                                  CONCAT44(auVar24._4_4_ *
                                                                           auVar24._4_4_,
                                                                           auVar24._0_4_ *
                                                                           auVar24._0_4_)))),auVar81
                                     );
            auVar90._0_4_ = auVar23._0_4_ + 1.0;
            auVar90._4_4_ = auVar23._4_4_ + 1.0;
            auVar90._8_4_ = auVar23._8_4_ + 1.0;
            auVar90._12_4_ = auVar23._12_4_ + 1.0;
            auVar90._16_4_ = 0x3f800000;
            auVar90._20_4_ = 0x3f800000;
            auVar90._24_4_ = 0x3f800000;
            auVar90._28_4_ = 0x3f800000;
            auVar99._0_4_ = (int)auVar79._0_4_;
            auVar99._4_4_ = (int)auVar79._4_4_;
            auVar99._8_4_ = (int)auVar79._8_4_;
            auVar99._12_4_ = (int)auVar79._12_4_;
            auVar99._16_4_ = (int)auVar79._16_4_;
            auVar99._20_4_ = (int)auVar79._20_4_;
            auVar99._24_4_ = (int)auVar79._24_4_;
            auVar99._28_4_ = (int)auVar79._28_4_;
            auVar80 = vpslld_avx2(auVar99,0x17);
            auVar80 = vpaddd_avx512vl(auVar80,auVar65);
            auVar23 = vfmadd213ps_fma(auVar80,auVar90,auVar131);
            uVar2 = vcmpps_avx512vl(ZEXT1632(auVar23),ZEXT1632(ZEXT816(0) << 0x40),2);
            auVar80 = vmaxps_avx512vl(ZEXT1632(auVar23),auVar66);
            auVar100 = vpsrld_avx2(auVar80,0x17);
            auVar80 = vpternlogd_avx512vl(auVar80,auVar67,auVar68,0xec);
            uVar3 = vcmpps_avx512vl(auVar80,auVar70,1);
            auVar81 = vaddps_avx512vl(auVar80,auVar71);
            auVar78 = vaddps_avx512vl(auVar81,auVar80);
            bVar1 = (bool)((byte)uVar3 & 1);
            auVar82._0_4_ = (float)((uint)bVar1 * auVar78._0_4_ | (uint)!bVar1 * auVar81._0_4_);
            bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
            auVar82._4_4_ = (float)((uint)bVar1 * auVar78._4_4_ | (uint)!bVar1 * auVar81._4_4_);
            bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
            auVar82._8_4_ = (float)((uint)bVar1 * auVar78._8_4_ | (uint)!bVar1 * auVar81._8_4_);
            bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
            auVar82._12_4_ = (float)((uint)bVar1 * auVar78._12_4_ | (uint)!bVar1 * auVar81._12_4_);
            bVar1 = (bool)((byte)(uVar3 >> 4) & 1);
            auVar82._16_4_ = (float)((uint)bVar1 * auVar78._16_4_ | (uint)!bVar1 * auVar81._16_4_);
            bVar1 = (bool)((byte)(uVar3 >> 5) & 1);
            auVar82._20_4_ = (float)((uint)bVar1 * auVar78._20_4_ | (uint)!bVar1 * auVar81._20_4_);
            bVar1 = (bool)((byte)(uVar3 >> 6) & 1);
            auVar82._24_4_ = (float)((uint)bVar1 * auVar78._24_4_ | (uint)!bVar1 * auVar81._24_4_);
            bVar1 = SUB81(uVar3 >> 7,0);
            auVar82._28_4_ = (uint)bVar1 * auVar78._28_4_ | (uint)!bVar1 * auVar81._28_4_;
            auVar10._4_4_ = auVar82._4_4_ * auVar82._4_4_;
            auVar10._0_4_ = auVar82._0_4_ * auVar82._0_4_;
            auVar10._8_4_ = auVar82._8_4_ * auVar82._8_4_;
            auVar10._12_4_ = auVar82._12_4_ * auVar82._12_4_;
            auVar10._16_4_ = auVar82._16_4_ * auVar82._16_4_;
            auVar10._20_4_ = auVar82._20_4_ * auVar82._20_4_;
            auVar10._24_4_ = auVar82._24_4_ * auVar82._24_4_;
            auVar10._28_4_ = auVar80._28_4_;
            auVar80 = vfmadd213ps_avx512vl(auVar72,auVar82,auVar73);
            auVar80 = vfmadd213ps_avx512vl(auVar80,auVar82,auVar74);
            auVar80 = vfmadd213ps_avx512vl(auVar80,auVar82,auVar75);
            auVar80 = vfmadd213ps_avx512vl(auVar80,auVar82,auVar76);
            auVar80 = vfmadd213ps_avx512vl(auVar80,auVar82,auVar77);
            auVar23 = vfmadd213ps_fma(auVar80,auVar82,auVar111);
            auVar6._8_4_ = 0xbe7ffffc;
            auVar6._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar6._12_4_ = 0xbe7ffffc;
            auVar6._16_4_ = 0xbe7ffffc;
            auVar6._20_4_ = 0xbe7ffffc;
            auVar6._24_4_ = 0xbe7ffffc;
            auVar6._28_4_ = 0xbe7ffffc;
            auVar80 = vfmadd213ps_avx512vl(ZEXT1632(auVar23),auVar82,auVar6);
            auVar7._8_4_ = 0x3eaaaaaa;
            auVar7._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar7._12_4_ = 0x3eaaaaaa;
            auVar7._16_4_ = 0x3eaaaaaa;
            auVar7._20_4_ = 0x3eaaaaaa;
            auVar7._24_4_ = 0x3eaaaaaa;
            auVar7._28_4_ = 0x3eaaaaaa;
            auVar80 = vfmadd213ps_avx512vl(auVar80,auVar82,auVar7);
            auVar11._4_4_ = auVar82._4_4_ * auVar82._4_4_ * auVar82._4_4_ * auVar80._4_4_;
            auVar11._0_4_ = auVar82._0_4_ * auVar82._0_4_ * auVar82._0_4_ * auVar80._0_4_;
            auVar11._8_4_ = auVar82._8_4_ * auVar82._8_4_ * auVar82._8_4_ * auVar80._8_4_;
            auVar11._12_4_ = auVar82._12_4_ * auVar82._12_4_ * auVar82._12_4_ * auVar80._12_4_;
            auVar11._16_4_ = auVar82._16_4_ * auVar82._16_4_ * auVar82._16_4_ * auVar80._16_4_;
            auVar11._20_4_ = auVar82._20_4_ * auVar82._20_4_ * auVar82._20_4_ * auVar80._20_4_;
            auVar11._24_4_ = auVar82._24_4_ * auVar82._24_4_ * auVar82._24_4_ * auVar80._24_4_;
            auVar11._28_4_ = auVar80._28_4_;
            auVar80 = vpaddd_avx512vl(auVar100,auVar69);
            auVar80 = vcvtdq2ps_avx(auVar80);
            auVar81 = vsubps_avx512vl(auVar80,auVar131);
            bVar1 = (bool)((byte)uVar3 & 1);
            auVar83._0_4_ = (uint)bVar1 * auVar81._0_4_ | (uint)!bVar1 * auVar80._0_4_;
            bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
            auVar83._4_4_ = (uint)bVar1 * auVar81._4_4_ | (uint)!bVar1 * auVar80._4_4_;
            bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
            auVar83._8_4_ = (uint)bVar1 * auVar81._8_4_ | (uint)!bVar1 * auVar80._8_4_;
            bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
            auVar83._12_4_ = (uint)bVar1 * auVar81._12_4_ | (uint)!bVar1 * auVar80._12_4_;
            bVar1 = (bool)((byte)(uVar3 >> 4) & 1);
            auVar83._16_4_ = (uint)bVar1 * auVar81._16_4_ | (uint)!bVar1 * auVar80._16_4_;
            bVar1 = (bool)((byte)(uVar3 >> 5) & 1);
            auVar83._20_4_ = (uint)bVar1 * auVar81._20_4_ | (uint)!bVar1 * auVar80._20_4_;
            bVar1 = (bool)((byte)(uVar3 >> 6) & 1);
            auVar83._24_4_ = (uint)bVar1 * auVar81._24_4_ | (uint)!bVar1 * auVar80._24_4_;
            bVar1 = SUB81(uVar3 >> 7,0);
            auVar83._28_4_ = (uint)bVar1 * auVar81._28_4_ | (uint)!bVar1 * auVar80._28_4_;
            auVar23 = vfmadd231ps_fma(auVar11,auVar83,auVar139);
            auVar23 = vfmsub231ps_fma(ZEXT1632(auVar23),auVar117,auVar10);
            auVar80 = vsubps_avx(ZEXT1632(auVar23),auVar82);
            auVar23 = vfmsub231ps_fma(auVar80,auVar135,auVar83);
            auVar8._8_4_ = 0xc0000000;
            auVar8._0_8_ = 0xc0000000c0000000;
            auVar8._12_4_ = 0xc0000000;
            auVar8._16_4_ = 0xc0000000;
            auVar8._20_4_ = 0xc0000000;
            auVar8._24_4_ = 0xc0000000;
            auVar8._28_4_ = 0xc0000000;
            auVar80 = vmulps_avx512vl(ZEXT1632(auVar23),auVar8);
            auVar81 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar1 = (bool)((byte)uVar2 & 1);
            auVar84._0_4_ = (uint)bVar1 * auVar81._0_4_ | (uint)!bVar1 * auVar80._0_4_;
            bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
            auVar84._4_4_ = (uint)bVar1 * auVar81._4_4_ | (uint)!bVar1 * auVar80._4_4_;
            bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
            auVar84._8_4_ = (uint)bVar1 * auVar81._8_4_ | (uint)!bVar1 * auVar80._8_4_;
            bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
            auVar84._12_4_ = (uint)bVar1 * auVar81._12_4_ | (uint)!bVar1 * auVar80._12_4_;
            bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
            auVar84._16_4_ = (uint)bVar1 * auVar81._16_4_ | (uint)!bVar1 * auVar80._16_4_;
            bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
            auVar84._20_4_ = (uint)bVar1 * auVar81._20_4_ | (uint)!bVar1 * auVar80._20_4_;
            bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
            auVar84._24_4_ = (uint)bVar1 * auVar81._24_4_ | (uint)!bVar1 * auVar80._24_4_;
            bVar1 = SUB81(uVar2 >> 7,0);
            auVar84._28_4_ = (uint)bVar1 * auVar81._28_4_ | (uint)!bVar1 * auVar80._28_4_;
            auVar80 = vminps_avx(auVar84,auVar113);
            auVar80 = vmaxps_avx(auVar80,auVar115);
            auVar23 = vfmadd213ps_fma(auVar124,auVar80,auVar117);
            auVar81 = vroundps_avx(ZEXT1632(auVar23),1);
            uVar2 = vcmpps_avx512vl(ZEXT1632(auVar23),auVar81,1);
            auVar78 = vsubps_avx512vl(auVar81,auVar131);
            bVar1 = (bool)((byte)uVar2 & 1);
            auVar85._0_4_ = (float)((uint)bVar1 * auVar78._0_4_ | (uint)!bVar1 * auVar81._0_4_);
            bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
            auVar85._4_4_ = (float)((uint)bVar1 * auVar78._4_4_ | (uint)!bVar1 * auVar81._4_4_);
            bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
            auVar85._8_4_ = (float)((uint)bVar1 * auVar78._8_4_ | (uint)!bVar1 * auVar81._8_4_);
            bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
            auVar85._12_4_ = (float)((uint)bVar1 * auVar78._12_4_ | (uint)!bVar1 * auVar81._12_4_);
            bVar1 = (bool)((byte)(uVar2 >> 4) & 1);
            auVar85._16_4_ = (float)((uint)bVar1 * auVar78._16_4_ | (uint)!bVar1 * auVar81._16_4_);
            bVar1 = (bool)((byte)(uVar2 >> 5) & 1);
            auVar85._20_4_ = (float)((uint)bVar1 * auVar78._20_4_ | (uint)!bVar1 * auVar81._20_4_);
            bVar1 = (bool)((byte)(uVar2 >> 6) & 1);
            auVar85._24_4_ = (float)((uint)bVar1 * auVar78._24_4_ | (uint)!bVar1 * auVar81._24_4_);
            bVar1 = SUB81(uVar2 >> 7,0);
            auVar85._28_4_ = (float)((uint)bVar1 * auVar78._28_4_ | (uint)!bVar1 * auVar81._28_4_);
            auVar23 = vfmsub231ps_fma(auVar80,auVar85,auVar135);
            auVar24 = vfnmsub231ps_fma(ZEXT1632(auVar23),auVar85,auVar139);
            auVar81 = ZEXT1632(auVar24);
            auVar23 = vfmadd213ps_fma(auVar150,auVar81,auVar146);
            auVar80 = vfmadd213ps_avx512vl(ZEXT1632(auVar23),auVar81,auVar62);
            auVar80 = vfmadd213ps_avx512vl(auVar80,auVar81,auVar63);
            auVar81 = ZEXT1632(auVar24);
            auVar80 = vfmadd213ps_avx512vl(auVar80,auVar81,auVar64);
            auVar23 = vfmadd213ps_fma(auVar80,auVar81,auVar117);
            auVar23 = vfmadd213ps_fma(ZEXT1632(auVar23),
                                      ZEXT1632(CONCAT412(auVar24._12_4_ * auVar24._12_4_,
                                                         CONCAT48(auVar24._8_4_ * auVar24._8_4_,
                                                                  CONCAT44(auVar24._4_4_ *
                                                                           auVar24._4_4_,
                                                                           auVar24._0_4_ *
                                                                           auVar24._0_4_)))),auVar81
                                     );
            auVar91._0_4_ = auVar23._0_4_ + 1.0;
            auVar91._4_4_ = auVar23._4_4_ + 1.0;
            auVar91._8_4_ = auVar23._8_4_ + 1.0;
            auVar91._12_4_ = auVar23._12_4_ + 1.0;
            auVar91._16_4_ = 0x3f800000;
            auVar91._20_4_ = 0x3f800000;
            auVar91._24_4_ = 0x3f800000;
            auVar91._28_4_ = 0x3f800000;
            auVar101._0_4_ = (int)auVar85._0_4_;
            auVar101._4_4_ = (int)auVar85._4_4_;
            auVar101._8_4_ = (int)auVar85._8_4_;
            auVar101._12_4_ = (int)auVar85._12_4_;
            auVar101._16_4_ = (int)auVar85._16_4_;
            auVar101._20_4_ = (int)auVar85._20_4_;
            auVar101._24_4_ = (int)auVar85._24_4_;
            auVar101._28_4_ = (int)auVar85._28_4_;
            auVar80 = vpslld_avx2(auVar101,0x17);
            auVar80 = vpaddd_avx512vl(auVar80,auVar65);
            auVar23 = vfmadd213ps_fma(auVar80,auVar91,auVar131);
            auVar80 = vrcpps_avx(ZEXT1632(auVar23));
            auVar23 = vfmsub213ps_fma(ZEXT1632(auVar23),auVar80,auVar131);
            auVar23 = vfnmadd132ps_fma(ZEXT1632(auVar23),auVar80,auVar80);
            auVar9._8_4_ = 0xc0000000;
            auVar9._0_8_ = 0xc0000000c0000000;
            auVar9._12_4_ = 0xc0000000;
            auVar9._16_4_ = 0xc0000000;
            auVar9._20_4_ = 0xc0000000;
            auVar9._24_4_ = 0xc0000000;
            auVar9._28_4_ = 0xc0000000;
            auVar80 = vfnmadd132ps_avx512vl(ZEXT1632(auVar23),auVar71,auVar9);
            auVar12._4_4_ = auVar80._4_4_ * auVar109._4_4_;
            auVar12._0_4_ = auVar80._0_4_ * auVar109._0_4_;
            auVar12._8_4_ = auVar80._8_4_ * auVar109._8_4_;
            auVar12._12_4_ = auVar80._12_4_ * auVar109._12_4_;
            auVar12._16_4_ = auVar80._16_4_ * auVar109._16_4_;
            auVar12._20_4_ = auVar80._20_4_ * auVar109._20_4_;
            auVar12._24_4_ = auVar80._24_4_ * auVar109._24_4_;
            auVar12._28_4_ = auVar109._28_4_;
            *pauVar21 = auVar12;
            pauVar21 = pauVar21 + 1;
            iVar14 = iVar14 + 8;
            uVar18 = uVar19 & 0xfffffff8;
          } while (iVar14 < (int)uVar19);
        }
        uVar16 = uVar18 | 3;
        auVar44._8_4_ = 0x42b0c0a5;
        auVar44._0_8_ = 0x42b0c0a542b0c0a5;
        auVar44._12_4_ = 0x42b0c0a5;
        auVar36._8_4_ = 0xc2b0c0a5;
        auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar36._12_4_ = 0xc2b0c0a5;
        auVar37._8_4_ = 0x3fb8aa3b;
        auVar37._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar37._12_4_ = 0x3fb8aa3b;
        auVar38._8_4_ = 0x3f000000;
        auVar38._0_8_ = 0x3f0000003f000000;
        auVar38._12_4_ = 0x3f000000;
        auVar126._8_4_ = 0x3f800000;
        auVar126._0_8_ = 0x3f8000003f800000;
        auVar126._12_4_ = 0x3f800000;
        auVar129._8_4_ = 0x3f318000;
        auVar129._0_8_ = 0x3f3180003f318000;
        auVar129._12_4_ = 0x3f318000;
        auVar133._8_4_ = 0xb95e8083;
        auVar133._0_8_ = 0xb95e8083b95e8083;
        auVar133._12_4_ = 0xb95e8083;
        auVar137._8_4_ = 0x3ab743ce;
        auVar137._0_8_ = 0x3ab743ce3ab743ce;
        auVar137._12_4_ = 0x3ab743ce;
        auVar144._8_4_ = 0x39506967;
        auVar144._0_8_ = 0x3950696739506967;
        auVar144._12_4_ = 0x39506967;
        auVar148._8_4_ = 0x3c088908;
        auVar148._0_8_ = 0x3c0889083c088908;
        auVar148._12_4_ = 0x3c088908;
        auVar23 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar24 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar25 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        auVar26 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar27 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar28 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar29 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar31 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar33 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
        auVar34 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar35 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar46 = vpxord_avx512vl(auVar67._0_16_,auVar67._0_16_);
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
        while ((int)uVar16 < (int)uVar19) {
          auVar107 = *(undefined1 (*) [16])*pauVar21;
          auVar49 = vminps_avx(auVar107,auVar44);
          auVar50 = vmaxps_avx(auVar49,auVar36);
          auVar48 = vfmadd213ps_fma(auVar37,auVar50,auVar38);
          auVar102._0_4_ = (int)auVar48._0_4_;
          auVar102._4_4_ = (int)auVar48._4_4_;
          auVar102._8_4_ = (int)auVar48._8_4_;
          auVar102._12_4_ = (int)auVar48._12_4_;
          auVar49 = vcvtdq2ps_avx(auVar102);
          uVar2 = vcmpps_avx512vl(auVar48,auVar49,1);
          auVar48 = vsubps_avx512vl(auVar49,auVar126);
          bVar1 = (bool)((byte)uVar2 & 1);
          auVar96._0_4_ = (float)((uint)bVar1 * auVar48._0_4_ | (uint)!bVar1 * auVar49._0_4_);
          bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
          auVar96._4_4_ = (float)((uint)bVar1 * auVar48._4_4_ | (uint)!bVar1 * auVar49._4_4_);
          bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
          auVar96._8_4_ = (float)((uint)bVar1 * auVar48._8_4_ | (uint)!bVar1 * auVar49._8_4_);
          bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
          auVar96._12_4_ = (float)((uint)bVar1 * auVar48._12_4_ | (uint)!bVar1 * auVar49._12_4_);
          auVar49 = vfmsub231ps_fma(auVar50,auVar96,auVar129);
          auVar50 = vfnmsub231ps_fma(auVar49,auVar96,auVar133);
          auVar94._0_4_ = auVar50._0_4_ * auVar50._0_4_;
          auVar94._4_4_ = auVar50._4_4_ * auVar50._4_4_;
          auVar94._8_4_ = auVar50._8_4_ * auVar50._8_4_;
          auVar94._12_4_ = auVar50._12_4_ * auVar50._12_4_;
          auVar49 = vfmadd213ps_fma(auVar144,auVar50,auVar137);
          auVar49 = vfmadd213ps_fma(auVar49,auVar50,auVar148);
          auVar49 = vfmadd213ps_avx512vl(auVar49,auVar50,auVar23);
          auVar49 = vfmadd213ps_avx512vl(auVar49,auVar50,auVar24);
          auVar49 = vfmadd213ps_fma(auVar49,auVar50,auVar38);
          auVar49 = vfmadd213ps_fma(auVar49,auVar94,auVar50);
          auVar87._0_4_ = auVar49._0_4_ + 1.0;
          auVar87._4_4_ = auVar49._4_4_ + 1.0;
          auVar87._8_4_ = auVar49._8_4_ + 1.0;
          auVar87._12_4_ = auVar49._12_4_ + 1.0;
          auVar95._0_4_ = (int)auVar96._0_4_;
          auVar95._4_4_ = (int)auVar96._4_4_;
          auVar95._8_4_ = (int)auVar96._8_4_;
          auVar95._12_4_ = (int)auVar96._12_4_;
          auVar49 = vpslld_avx(auVar95,0x17);
          auVar49 = vpaddd_avx512vl(auVar49,auVar25);
          auVar49 = vfmadd213ps_fma(auVar49,auVar87,auVar126);
          uVar2 = vcmpps_avx512vl(auVar49,auVar46,2);
          auVar50._8_4_ = 0x800000;
          auVar50._0_8_ = 0x80000000800000;
          auVar50._12_4_ = 0x800000;
          auVar50 = vmaxps_avx512vl(auVar49,auVar50);
          auVar96 = vpsrld_avx(auVar50,0x17);
          auVar103._8_4_ = 0x807fffff;
          auVar103._0_8_ = 0x807fffff807fffff;
          auVar103._12_4_ = 0x807fffff;
          auVar49._8_4_ = 0x3f000000;
          auVar49._0_8_ = 0x3f0000003f000000;
          auVar49._12_4_ = 0x3f000000;
          auVar49 = vpternlogd_avx512vl(auVar50,auVar103,auVar49,0xea);
          uVar3 = vcmpps_avx512vl(auVar49,auVar26,1);
          auVar50 = vaddps_avx512vl(auVar49,auVar27);
          auVar49 = vaddps_avx512vl(auVar50,auVar49);
          bVar1 = (bool)((byte)uVar3 & 1);
          auVar51._0_4_ = (float)((uint)bVar1 * auVar49._0_4_ | (uint)!bVar1 * auVar50._0_4_);
          bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
          auVar51._4_4_ = (float)((uint)bVar1 * auVar49._4_4_ | (uint)!bVar1 * auVar50._4_4_);
          bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
          auVar51._8_4_ = (float)((uint)bVar1 * auVar49._8_4_ | (uint)!bVar1 * auVar50._8_4_);
          bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
          auVar51._12_4_ = (float)((uint)bVar1 * auVar49._12_4_ | (uint)!bVar1 * auVar50._12_4_);
          auVar88._0_4_ = auVar51._0_4_ * auVar51._0_4_;
          auVar88._4_4_ = auVar51._4_4_ * auVar51._4_4_;
          auVar88._8_4_ = auVar51._8_4_ * auVar51._8_4_;
          auVar88._12_4_ = auVar51._12_4_ * auVar51._12_4_;
          auVar49 = vfmadd213ps_avx512vl(auVar28,auVar51,auVar29);
          auVar49 = vfmadd213ps_avx512vl(auVar49,auVar51,auVar30);
          auVar49 = vfmadd213ps_avx512vl(auVar49,auVar51,auVar31);
          auVar49 = vfmadd213ps_avx512vl(auVar49,auVar51,auVar32);
          auVar49 = vfmadd213ps_avx512vl(auVar49,auVar51,auVar33);
          auVar49 = vfmadd213ps_avx512vl(auVar49,auVar51,auVar34);
          auVar49 = vfmadd213ps_avx512vl(auVar49,auVar51,auVar35);
          auVar49 = vfmadd213ps_avx512vl(auVar49,auVar51,auVar45);
          auVar108._0_4_ = auVar88._0_4_ * auVar51._0_4_ * auVar49._0_4_;
          auVar108._4_4_ = auVar88._4_4_ * auVar51._4_4_ * auVar49._4_4_;
          auVar108._8_4_ = auVar88._8_4_ * auVar51._8_4_ * auVar49._8_4_;
          auVar108._12_4_ = auVar88._12_4_ * auVar51._12_4_ * auVar49._12_4_;
          auVar48._8_4_ = 0xffffff82;
          auVar48._0_8_ = 0xffffff82ffffff82;
          auVar48._12_4_ = 0xffffff82;
          auVar49 = vpaddd_avx512vl(auVar96,auVar48);
          auVar49 = vcvtdq2ps_avx(auVar49);
          auVar50 = vsubps_avx512vl(auVar49,auVar126);
          bVar1 = (bool)((byte)uVar3 & 1);
          auVar52._0_4_ = (uint)bVar1 * auVar50._0_4_ | (uint)!bVar1 * auVar49._0_4_;
          bVar1 = (bool)((byte)(uVar3 >> 1) & 1);
          auVar52._4_4_ = (uint)bVar1 * auVar50._4_4_ | (uint)!bVar1 * auVar49._4_4_;
          bVar1 = (bool)((byte)(uVar3 >> 2) & 1);
          auVar52._8_4_ = (uint)bVar1 * auVar50._8_4_ | (uint)!bVar1 * auVar49._8_4_;
          bVar1 = (bool)((byte)(uVar3 >> 3) & 1);
          auVar52._12_4_ = (uint)bVar1 * auVar50._12_4_ | (uint)!bVar1 * auVar49._12_4_;
          auVar49 = vfmadd231ps_fma(auVar108,auVar52,auVar133);
          auVar49 = vfmsub231ps_fma(auVar49,auVar38,auVar88);
          auVar49 = vsubps_avx(auVar49,auVar51);
          auVar49 = vfnmadd231ps_fma(auVar49,auVar129,auVar52);
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar1 = (bool)((byte)uVar2 & 1);
          auVar53._0_4_ =
               (uint)bVar1 * auVar50._0_4_ | (uint)!bVar1 * (int)(auVar49._0_4_ + auVar49._0_4_);
          bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
          auVar53._4_4_ =
               (uint)bVar1 * auVar50._4_4_ | (uint)!bVar1 * (int)(auVar49._4_4_ + auVar49._4_4_);
          bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
          auVar53._8_4_ =
               (uint)bVar1 * auVar50._8_4_ | (uint)!bVar1 * (int)(auVar49._8_4_ + auVar49._8_4_);
          bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
          auVar53._12_4_ =
               (uint)bVar1 * auVar50._12_4_ | (uint)!bVar1 * (int)(auVar49._12_4_ + auVar49._12_4_);
          auVar49 = vminps_avx(auVar53,auVar44);
          auVar50 = vmaxps_avx(auVar49,auVar36);
          auVar48 = vfmadd213ps_fma(auVar37,auVar50,auVar38);
          auVar104._0_4_ = (int)auVar48._0_4_;
          auVar104._4_4_ = (int)auVar48._4_4_;
          auVar104._8_4_ = (int)auVar48._8_4_;
          auVar104._12_4_ = (int)auVar48._12_4_;
          auVar49 = vcvtdq2ps_avx(auVar104);
          uVar2 = vcmpps_avx512vl(auVar48,auVar49,1);
          auVar48 = vsubps_avx512vl(auVar49,auVar126);
          bVar1 = (bool)((byte)uVar2 & 1);
          auVar54._0_4_ = (float)((uint)bVar1 * auVar48._0_4_ | (uint)!bVar1 * auVar49._0_4_);
          bVar1 = (bool)((byte)(uVar2 >> 1) & 1);
          auVar54._4_4_ = (float)((uint)bVar1 * auVar48._4_4_ | (uint)!bVar1 * auVar49._4_4_);
          bVar1 = (bool)((byte)(uVar2 >> 2) & 1);
          auVar54._8_4_ = (float)((uint)bVar1 * auVar48._8_4_ | (uint)!bVar1 * auVar49._8_4_);
          bVar1 = (bool)((byte)(uVar2 >> 3) & 1);
          auVar54._12_4_ = (float)((uint)bVar1 * auVar48._12_4_ | (uint)!bVar1 * auVar49._12_4_);
          auVar49 = vfmsub231ps_fma(auVar50,auVar54,auVar129);
          auVar50 = vfnmsub231ps_fma(auVar49,auVar54,auVar133);
          auVar97._0_4_ = auVar50._0_4_ * auVar50._0_4_;
          auVar97._4_4_ = auVar50._4_4_ * auVar50._4_4_;
          auVar97._8_4_ = auVar50._8_4_ * auVar50._8_4_;
          auVar97._12_4_ = auVar50._12_4_ * auVar50._12_4_;
          auVar49 = vfmadd213ps_fma(auVar144,auVar50,auVar137);
          auVar49 = vfmadd213ps_fma(auVar49,auVar50,auVar148);
          auVar49 = vfmadd213ps_avx512vl(auVar49,auVar50,auVar23);
          auVar49 = vfmadd213ps_avx512vl(auVar49,auVar50,auVar24);
          auVar49 = vfmadd213ps_fma(auVar49,auVar50,auVar38);
          auVar49 = vfmadd213ps_fma(auVar49,auVar97,auVar50);
          auVar89._0_4_ = auVar49._0_4_ + 1.0;
          auVar89._4_4_ = auVar49._4_4_ + 1.0;
          auVar89._8_4_ = auVar49._8_4_ + 1.0;
          auVar89._12_4_ = auVar49._12_4_ + 1.0;
          auVar98._0_4_ = (int)auVar54._0_4_;
          auVar98._4_4_ = (int)auVar54._4_4_;
          auVar98._8_4_ = (int)auVar54._8_4_;
          auVar98._12_4_ = (int)auVar54._12_4_;
          auVar49 = vpslld_avx(auVar98,0x17);
          auVar49 = vpaddd_avx512vl(auVar49,auVar25);
          auVar50 = vfmadd213ps_fma(auVar49,auVar89,auVar126);
          auVar49 = vrcpps_avx(auVar50);
          auVar105._0_4_ = auVar49._0_4_ + auVar49._0_4_;
          auVar105._4_4_ = auVar49._4_4_ + auVar49._4_4_;
          auVar105._8_4_ = auVar49._8_4_ + auVar49._8_4_;
          auVar105._12_4_ = auVar49._12_4_ + auVar49._12_4_;
          auVar50 = vfmsub213ps_avx512vl(auVar50,auVar105,auVar47);
          auVar49 = vfnmadd213ps_fma(auVar50,auVar49,auVar105);
          auVar107 = vfmsub213ps_fma(auVar49,auVar107,auVar107);
          *(undefined1 (*) [16])*pauVar21 = auVar107;
          pauVar21 = (undefined1 (*) [32])(*pauVar21 + 0x10);
          uVar16 = uVar18 + 7;
          uVar18 = uVar18 + 4;
        }
        if (uVar19 - uVar18 != 0 && (int)uVar18 <= (int)uVar19) {
          lVar22 = 0;
          do {
            __x = *(float *)(*pauVar21 + lVar22 * 4);
            fVar86 = expf(__x);
            fVar86 = logf(fVar86 + 1.0);
            fVar86 = tanhf(fVar86);
            *(float *)(*pauVar21 + lVar22 * 4) = fVar86 * __x;
            lVar22 = lVar22 + 1;
          } while (uVar19 - uVar18 != (int)lVar22);
        }
        uVar15 = uVar15 + 1;
        auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar63 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar64 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar65 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        auVar66 = vbroadcastss_avx512vl(ZEXT416(0x800000));
        auVar67 = vpbroadcastd_avx512vl(ZEXT416(0x3f000000));
        auVar68 = vpbroadcastd_avx512vl(ZEXT416(0x807fffff));
        auVar69 = vpbroadcastd_avx512vl(ZEXT416(0xffffff82));
        auVar70 = vbroadcastss_avx512vl(ZEXT416(0x3f3504f3));
        auVar71 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar72 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar73 = vbroadcastss_avx512vl(ZEXT416(0xbdebd1b8));
        auVar74 = vbroadcastss_avx512vl(ZEXT416(0x3def251a));
        auVar75 = vbroadcastss_avx512vl(ZEXT416(0xbdfe5d4f));
        auVar76 = vbroadcastss_avx512vl(ZEXT416(0x3e11e9bf));
        auVar77 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      } while (uVar15 != uVar20);
    }
  }
  return 0;
}

Assistant:

int Mish_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_top_blob, tmp, 8, opt);

        forward_inplace(tmp, opt);

        convert_packing(tmp, bottom_top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = mish_avx(_p);
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                _p = mish_sse(_p);
                _mm_storeu_ps(ptr, _p);
                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = mish_avx(_p);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            _p = mish_sse(_p);
            _mm_storeu_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = *ptr * tanhf(logf(expf(*ptr) + 1.f));
            ptr++;
        }
    }

    return 0;
}